

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_fast_noDict_6_0
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  U32 UVar8;
  U32 UVar9;
  U32 UVar10;
  uint uVar11;
  BYTE *pBVar12;
  size_t sVar13;
  BYTE *in_RCX;
  uint *in_RDX;
  void *dst;
  long *in_RSI;
  ZSTD_matchState_t *in_RDI;
  ulong uVar14;
  long in_R8;
  bool bVar15;
  U32 tmpOff;
  size_t rLength;
  U32 rval;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  size_t kStepIncr;
  BYTE *nextStep;
  size_t step;
  size_t mLength;
  BYTE *match0;
  U32 offcode;
  U32 mval;
  U32 idx;
  size_t hash1;
  size_t hash0;
  U32 offsetSaved2;
  U32 offsetSaved1;
  U32 rep_offset2;
  U32 rep_offset1;
  U32 current0;
  BYTE *ip3;
  BYTE *ip2;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *anchor;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 endIndex;
  BYTE *istart;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  undefined4 in_stack_fffffffffffffc68;
  U32 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc70;
  U32 in_stack_fffffffffffffc74;
  U32 *in_stack_fffffffffffffc78;
  BYTE *in_stack_fffffffffffffc80;
  U32 *in_stack_fffffffffffffc98;
  BYTE *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  U32 in_stack_fffffffffffffcac;
  uint local_33c;
  uint local_338;
  uint local_334;
  BYTE *local_2b8;
  ulong local_2b0;
  long local_2a8;
  BYTE *local_2a0;
  int local_294;
  U32 local_290;
  uint local_28c;
  size_t local_288;
  size_t local_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  U32 local_264;
  BYTE *local_260;
  BYTE *local_258;
  BYTE *local_250;
  BYTE *local_248;
  BYTE *local_240;
  size_t local_1a8;
  size_t local_190;
  size_t local_178;
  size_t local_160;
  size_t local_148;
  size_t local_130;
  size_t local_118;
  void *local_78;
  BYTE *local_70;
  
  pUVar3 = in_RDI->hashTable;
  pBVar4 = (in_RDI->window).base;
  iVar6 = (int)pBVar4;
  UVar8 = ZSTD_getLowestPrefixIndex
                    (in_RDI,((int)in_RCX - iVar6) + (int)in_R8,(in_RDI->cParams).windowLog);
  pBVar12 = in_RCX + in_R8 + -8;
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  local_270 = 0;
  local_274 = 0;
  local_248 = in_RCX + (int)(uint)(in_RCX == pBVar4 + UVar8);
  UVar9 = (int)local_248 - iVar6;
  UVar10 = ZSTD_getLowestPrefixIndex(in_RDI,UVar9,(in_RDI->cParams).windowLog);
  uVar11 = UVar9 - UVar10;
  local_26c = uVar2;
  if (uVar11 < uVar2) {
    local_26c = 0;
    local_274 = uVar2;
  }
  local_268 = uVar1;
  local_240 = in_RCX;
  if (uVar11 < uVar1) {
    local_268 = 0;
    local_270 = uVar1;
  }
  while( true ) {
    local_2b8 = local_248 + 0x80;
    local_250 = local_248 + 1;
    local_258 = local_248 + 2;
    local_260 = local_248 + 3;
    if (pBVar12 <= local_260) break;
    switch(0xa5d85f) {
    case 0:
      local_118 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 1:
      local_118 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 2:
      local_118 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 3:
      local_118 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 4:
      local_118 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
    }
    local_280 = local_118;
    switch(0xa5d95c) {
    case 0:
      local_130 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 1:
      local_130 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 2:
      local_130 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 3:
      local_130 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
      break;
    case 4:
      local_130 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70
                                                ),in_stack_fffffffffffffc6c);
    }
    local_288 = local_130;
    local_28c = pUVar3[local_118];
    local_2b0 = 2;
    while( true ) {
      UVar9 = MEM_read32(local_258 + -(ulong)local_268);
      local_264 = (int)local_248 - iVar6;
      pUVar3[local_280] = local_264;
      UVar10 = MEM_read32(local_258);
      iVar7 = (int)local_250;
      if (UVar10 == UVar9 && local_268 != 0) break;
      if (local_28c < UVar8) {
        local_290 = MEM_read32(local_248);
        local_290 = local_290 ^ 1;
      }
      else {
        local_290 = MEM_read32(pBVar4 + local_28c);
      }
      UVar9 = MEM_read32(local_248);
      if (UVar9 == local_290) {
        pUVar3[local_288] = iVar7 - iVar6;
LAB_00a5e07c:
        local_2a0 = pBVar4 + local_28c;
        local_26c = local_268;
        local_268 = (int)local_248 - (int)local_2a0;
        local_294 = local_268 + 3;
        local_2a8 = 4;
        while( true ) {
          bVar15 = false;
          if (local_240 < local_248 && pBVar4 + UVar8 < local_2a0) {
            bVar15 = local_248[-1] == local_2a0[-1];
          }
          if (!bVar15) break;
          local_248 = local_248 + -1;
          local_2a0 = local_2a0 + -1;
          local_2a8 = local_2a8 + 1;
        }
        goto LAB_00a5e186;
      }
      local_28c = pUVar3[local_288];
      switch(0xa5dc9f) {
      case 0:
        local_148 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 1:
        local_148 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 2:
        local_148 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 3:
        local_148 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 4:
        local_148 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
      }
      local_248 = local_250;
      local_264 = iVar7 - iVar6;
      pUVar3[local_288] = local_264;
      if (local_28c < UVar8) {
        local_290 = MEM_read32(local_250);
        local_290 = local_290 ^ 1;
      }
      else {
        local_290 = MEM_read32(pBVar4 + local_28c);
      }
      UVar9 = MEM_read32(local_250);
      if (UVar9 == local_290) {
        if (local_2b0 < 5) {
          pUVar3[local_148] = (int)local_258 - iVar6;
        }
        goto LAB_00a5e07c;
      }
      local_28c = pUVar3[local_148];
      local_280 = local_148;
      switch(0xa5debf) {
      case 0:
        local_160 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 1:
        local_160 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 2:
        local_160 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 3:
        local_160 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 4:
        local_160 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
      }
      local_288 = local_160;
      local_248 = local_258;
      local_250 = local_260;
      local_258 = local_258 + local_2b0;
      local_260 = local_260 + local_2b0;
      if (local_2b8 <= local_258) {
        local_2b0 = local_2b0 + 1;
        local_2b8 = local_2b8 + 0x80;
      }
      if (pBVar12 <= local_260) goto LAB_00a5dfeb;
    }
    local_248 = local_258 + -(ulong)(local_258[-1] == local_258[-1 - (ulong)local_268]);
    local_294 = 1;
    local_2a8 = (ulong)(local_258[-1] == local_258[-1 - (ulong)local_268]) + 4;
    pUVar3[local_288] = iVar7 - iVar6;
LAB_00a5e186:
    sVar13 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                        in_stack_fffffffffffffca0,(BYTE *)in_stack_fffffffffffffc98);
    uVar14 = (long)local_248 - (long)local_240;
    if (in_RCX + in_R8 + -0x20 < local_240 + uVar14) {
      ZSTD_safecopyLiterals
                (in_stack_fffffffffffffc80,(BYTE *)in_stack_fffffffffffffc78,
                 (BYTE *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (BYTE *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    }
    else {
      ZSTD_copy16((void *)in_RSI[3],local_240);
      if (0x10 < uVar14) {
        lVar5 = in_RSI[3];
        dst = (void *)(lVar5 + 0x10);
        ZSTD_copy16(dst,local_240 + 0x10);
        if (0x10 < (long)(uVar14 - 0x10)) {
          local_78 = (void *)(lVar5 + 0x20);
          do {
            local_70 = local_240 + 0x20;
            ZSTD_copy16(local_78,local_70);
            ZSTD_copy16((void *)((long)local_78 + 0x10),local_240 + 0x30);
            local_78 = (void *)((long)local_78 + 0x20);
            local_240 = local_70;
          } while (local_78 < (void *)((long)dst + (uVar14 - 0x10)));
        }
      }
    }
    in_RSI[3] = uVar14 + in_RSI[3];
    if (0xffff < uVar14) {
      *(undefined4 *)(in_RSI + 9) = 1;
      *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
    }
    *(short *)(in_RSI[1] + 4) = (short)uVar14;
    *(int *)in_RSI[1] = local_294;
    uVar14 = (sVar13 + local_2a8) - 3;
    if (0xffff < uVar14) {
      *(undefined4 *)(in_RSI + 9) = 2;
      *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
    }
    *(short *)(in_RSI[1] + 6) = (short)uVar14;
    in_RSI[1] = in_RSI[1] + 8;
    local_248 = local_248 + sVar13 + local_2a8;
    local_240 = local_248;
    if (local_248 <= pBVar12) {
      in_stack_fffffffffffffcac = local_264 + 2;
      switch(0xa5e6c1) {
      case 0:
        local_178 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 1:
        local_178 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 2:
        local_178 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 3:
        local_178 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 4:
        local_178 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
      }
      pUVar3[local_178] = in_stack_fffffffffffffcac;
      in_stack_fffffffffffffca0 = (BYTE *)0x2;
      in_stack_fffffffffffffc98 = pUVar3;
      switch(0xa5e7e2) {
      case 0:
        local_190 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 1:
        local_190 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 2:
        local_190 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 3:
        local_190 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
        break;
      case 4:
        local_190 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                   in_stack_fffffffffffffc70),
                                  in_stack_fffffffffffffc6c);
      }
      in_stack_fffffffffffffc98[local_190] = ((int)local_248 + -2) - iVar6;
      if (local_26c != 0) {
        while( true ) {
          uVar1 = local_26c;
          bVar15 = false;
          if (local_240 <= pBVar12) {
            UVar9 = MEM_read32(local_240);
            UVar10 = MEM_read32(local_240 + -(ulong)local_26c);
            bVar15 = UVar9 == UVar10;
          }
          local_248 = local_240;
          if (!bVar15) break;
          sVar13 = ZSTD_count((BYTE *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                              in_stack_fffffffffffffca0,(BYTE *)in_stack_fffffffffffffc98);
          local_26c = local_268;
          local_268 = uVar1;
          in_stack_fffffffffffffc74 = (int)local_240 - iVar6;
          in_stack_fffffffffffffc80 = (BYTE *)0x2;
          in_stack_fffffffffffffc78 = pUVar3;
          switch(0xa5e9ce) {
          case 0:
            local_1a8 = ZSTD_hash4Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                       in_stack_fffffffffffffc70),
                                      in_stack_fffffffffffffc6c);
            break;
          case 1:
            local_1a8 = ZSTD_hash5Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                       in_stack_fffffffffffffc70),
                                      in_stack_fffffffffffffc6c);
            break;
          case 2:
            local_1a8 = ZSTD_hash6Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                       in_stack_fffffffffffffc70),
                                      in_stack_fffffffffffffc6c);
            break;
          case 3:
            local_1a8 = ZSTD_hash7Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                       in_stack_fffffffffffffc70),
                                      in_stack_fffffffffffffc6c);
            break;
          case 4:
            local_1a8 = ZSTD_hash8Ptr((void *)CONCAT44(in_stack_fffffffffffffc74,
                                                       in_stack_fffffffffffffc70),
                                      in_stack_fffffffffffffc6c);
          }
          in_stack_fffffffffffffc78[local_1a8] = in_stack_fffffffffffffc74;
          if (in_RCX + in_R8 + -0x20 < local_240) {
            ZSTD_safecopyLiterals
                      (in_stack_fffffffffffffc80,(BYTE *)in_stack_fffffffffffffc78,
                       (BYTE *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (BYTE *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
          }
          else {
            ZSTD_copy16((void *)in_RSI[3],local_240);
          }
          in_RSI[3] = in_RSI[3];
          *(undefined2 *)(in_RSI[1] + 4) = 0;
          *(undefined4 *)in_RSI[1] = 1;
          if (0xffff < sVar13 + 1) {
            *(undefined4 *)(in_RSI + 9) = 2;
            *(int *)((long)in_RSI + 0x4c) = (int)(in_RSI[1] - *in_RSI >> 3);
          }
          *(short *)(in_RSI[1] + 6) = (short)(sVar13 + 1);
          in_RSI[1] = in_RSI[1] + 8;
          local_240 = local_240 + sVar13 + 4;
        }
      }
    }
  }
LAB_00a5dfeb:
  if ((local_270 == 0) || (local_268 == 0)) {
    local_334 = local_274;
  }
  else {
    local_334 = local_270;
  }
  if (local_268 == 0) {
    local_338 = local_270;
  }
  else {
    local_338 = local_268;
  }
  *in_RDX = local_338;
  if (local_26c == 0) {
    local_33c = local_334;
  }
  else {
    local_33c = local_26c;
  }
  in_RDX[1] = local_33c;
  return (size_t)(in_RCX + (in_R8 - (long)local_240));
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}